

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O1

Float __thiscall
pbrt::ExhaustiveLightSampler::PDF
          (ExhaustiveLightSampler *this,LightSampleContext *ctx,LightHandle *light)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  undefined1 auVar8 [16];
  Float FVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  float fVar11;
  undefined1 in_XMM4 [16];
  Point3f p;
  
  auVar8 = in_ZMM0._8_16_;
  sVar3 = HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
          ::FindOffset(&this->lightToBoundedIndex,light);
  if ((this->lightToBoundedIndex).table.ptr[sVar3].set == true) {
    if ((this->boundedLights).nStored == 0) {
      fVar7 = NAN;
    }
    else {
      fVar11 = 0.0;
      lVar4 = 0;
      fVar7 = 0.0;
      uVar5 = 0;
      do {
        auVar8._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
        auVar8._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
        auVar8._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
        auVar8._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        uVar1 = *(undefined8 *)
                 &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x.high;
        auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
        auVar10._0_4_ = (float)uVar1 + auVar8._0_4_;
        auVar10._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar8._4_4_;
        auVar10._8_4_ = auVar8._8_4_ + 0.0;
        auVar10._12_4_ = auVar8._12_4_ + 0.0;
        auVar2._8_4_ = 0x3f000000;
        auVar2._0_8_ = 0x3f0000003f000000;
        auVar2._12_4_ = 0x3f000000;
        auVar8 = vmulps_avx512vl(auVar10,auVar2);
        p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar8._0_8_;
        p.super_Tuple3<pbrt::Point3,_float>.z =
             ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        FVar9 = LightBounds::Importance
                          ((LightBounds *)
                           ((long)&(((this->lightBounds).ptr)->bounds).pMin.
                                   super_Tuple3<pbrt::Point3,_float>.x + lVar4),p,
                           (Normal3f)(ctx->n).super_Tuple3<pbrt::Normal3,_float>);
        fVar11 = fVar11 + FVar9;
        bVar6 = (light->
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                ).bits == (this->boundedLights).ptr[uVar5].
                          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                          .bits;
        fVar7 = (float)((uint)bVar6 * (int)FVar9 + (uint)!bVar6 * (int)fVar7);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x34;
      } while (uVar5 < (this->boundedLights).nStored);
      fVar7 = fVar7 / fVar11;
    }
    sVar3 = (this->infiniteLights).nStored;
    auVar8 = vcvtusi2ss_avx512f(in_XMM4,sVar3);
    auVar2 = vcvtusi2ss_avx512f(in_XMM4,(sVar3 + 1) - (ulong)((this->lightBounds).nStored == 0));
    fVar7 = (1.0 - auVar8._0_4_ / auVar2._0_4_) * fVar7;
  }
  else {
    auVar8 = vcvtusi2ss_avx512f(auVar8,((this->infiniteLights).nStored + 1) -
                                       (ulong)((this->lightBounds).nStored == 0));
    fVar7 = 1.0 / auVar8._0_4_;
  }
  return fVar7;
}

Assistant:

Float ExhaustiveLightSampler::PDF(const LightSampleContext &ctx,
                                  LightHandle light) const {
    if (!lightToBoundedIndex.HasKey(light))
        return 1.f / (infiniteLights.size() + (!lightBounds.empty() ? 1 : 0));

    Float importanceSum = 0;
    Float lightImportance = 0;
    for (size_t i = 0; i < boundedLights.size(); ++i) {
        Float importance = lightBounds[i].Importance(ctx.p(), ctx.n);
        importanceSum += importance;
        if (light == boundedLights[i])
            lightImportance = importance;
    }
    Float pInfinite = Float(infiniteLights.size()) /
                      Float(infiniteLights.size() + (!lightBounds.empty() ? 1 : 0));
    Float pdf = lightImportance / importanceSum * (1. - pInfinite);
    return pdf;
}